

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escaping.cc
# Opt level: O0

string * __thiscall
absl::lts_20250127::HexStringToBytes_abi_cxx11_
          (string *__return_storage_ptr__,lts_20250127 *this,string_view from)

{
  size_type sVar1;
  const_pointer from_00;
  size_type num;
  undefined1 local_20 [8];
  string_view from_local;
  string *result;
  
  from_local._M_len = from._M_len;
  local_20 = (undefined1  [8])this;
  from_local._M_str = (char *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)local_20);
  strings_internal::STLStringResizeUninitialized<std::__cxx11::string,void>
            (__return_storage_ptr__,sVar1 >> 1);
  from_00 = std::basic_string_view<char,_std::char_traits<char>_>::data
                      ((basic_string_view<char,_std::char_traits<char>_> *)local_20);
  (anonymous_namespace)::HexStringToBytesInternal<std::__cxx11::string&>
            (from_00,__return_storage_ptr__,sVar1 >> 1);
  return __return_storage_ptr__;
}

Assistant:

std::string HexStringToBytes(absl::string_view from) {
  std::string result;
  const auto num = from.size() / 2;
  strings_internal::STLStringResizeUninitialized(&result, num);
  absl::HexStringToBytesInternal<std::string&>(from.data(), result, num);
  return result;
}